

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O3

PacketProtocolLayer *
ssh2_connection_new(Ssh *ssh,ssh_sharing_state *connshare,_Bool is_simple,Conf *conf,
                   char *peer_verstring,bufchain *user_input,ConnectionLayer **cl_out)

{
  ConnectionLayer *cl;
  _Bool _Var1;
  void *__s;
  Conf *conf_00;
  char *pcVar2;
  tree234 *ptVar3;
  LogContext *pLVar4;
  PortFwdManager *pPVar5;
  
  __s = safemalloc(1,0x150,0);
  memset(__s,0,0x150);
  *(PacketProtocolLayerVtable **)((long)__s + 0xe8) = &ssh2_connection_vtable;
  conf_00 = conf_copy(conf);
  *(Conf **)((long)__s + 0x50) = conf_00;
  *(_Bool *)((long)__s + 0x48) = is_simple;
  _Var1 = conf_get_bool(conf_00,0x32);
  *(_Bool *)((long)__s + 0x49) = _Var1;
  *(ssh_sharing_state **)((long)__s + 8) = connshare;
  pcVar2 = dupstr(peer_verstring);
  *(char **)((long)__s + 0x10) = pcVar2;
  ptVar3 = newtree234(ssh2_channelcmp);
  *(tree234 **)((long)__s + 0x58) = ptVar3;
  ptVar3 = newtree234(x11_authcmp);
  *(tree234 **)((long)__s + 0x68) = ptVar3;
  *(bufchain **)((long)__s + 0x40) = user_input;
  cl = (ConnectionLayer *)((long)__s + 0xd8);
  *(ConnectionLayerVtable **)((long)__s + 0xe0) = &ssh2_connlayer_vtable;
  pLVar4 = ssh_get_logctx(ssh);
  *(LogContext **)((long)__s + 0xd8) = pLVar4;
  pPVar5 = portfwdmgr_new(cl);
  *(PortFwdManager **)((long)__s + 0x80) = pPVar5;
  *cl_out = cl;
  if (*(ssh_sharing_state **)((long)__s + 8) != (ssh_sharing_state *)0x0) {
    ssh_connshare_provide_connlayer(*(ssh_sharing_state **)((long)__s + 8),cl);
  }
  return (PacketProtocolLayer *)((long)__s + 0xe8);
}

Assistant:

PacketProtocolLayer *ssh2_connection_new(
    Ssh *ssh, ssh_sharing_state *connshare, bool is_simple,
    Conf *conf, const char *peer_verstring, bufchain *user_input,
    ConnectionLayer **cl_out)
{
    struct ssh2_connection_state *s = snew(struct ssh2_connection_state);
    memset(s, 0, sizeof(*s));
    s->ppl.vt = &ssh2_connection_vtable;

    s->conf = conf_copy(conf);

    s->ssh_is_simple = is_simple;

    /*
     * If the ssh_no_shell option is enabled, we disable the usual
     * termination check, so that we persist even in the absence of
     * any at all channels (because our purpose is probably to be a
     * background port forwarder).
     */
    s->persistent = conf_get_bool(s->conf, CONF_ssh_no_shell);

    s->connshare = connshare;
    s->peer_verstring = dupstr(peer_verstring);

    s->channels = newtree234(ssh2_channelcmp);

    s->x11authtree = newtree234(x11_authcmp);

    s->user_input = user_input;

    /* Need to get the log context for s->cl now, because we won't be
     * helpfully notified when a copy is written into s->ppl by our
     * owner. */
    s->cl.vt = &ssh2_connlayer_vtable;
    s->cl.logctx = ssh_get_logctx(ssh);

    s->portfwdmgr = portfwdmgr_new(&s->cl);

    *cl_out = &s->cl;
    if (s->connshare)
        ssh_connshare_provide_connlayer(s->connshare, &s->cl);

    return &s->ppl;
}